

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

int stbtt_GetGlyphShape(stbtt_fontinfo *info,int glyph_index,stbtt_vertex **pvertices)

{
  uchar uVar1;
  uchar uVar2;
  short sVar3;
  uchar *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int cx;
  int cy;
  ushort uVar8;
  undefined8 ptr;
  ushort uVar9;
  int iVar10;
  uint uVar11;
  int num_vertices;
  int iVar12;
  ulong uVar13;
  stbtt_vertex *vertices;
  ushort *puVar14;
  ushort *puVar15;
  stbtt_vertex *psVar16;
  long lVar17;
  short sVar18;
  int was_off;
  int iVar19;
  ulong uVar20;
  int iVar21;
  stbtt_int32 sVar22;
  byte bVar23;
  short sVar24;
  int sx;
  byte bVar25;
  int sy;
  ushort uVar26;
  long lVar27;
  int iVar28;
  stbtt_int32 sVar29;
  uint uVar30;
  int iVar31;
  float fVar32;
  float fVar35;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_d8 [16];
  stbtt__csctx local_a8;
  stbtt__csctx count_ctx;
  
  if ((info->cff).size == 0) {
    puVar4 = info->data;
    uVar11 = stbtt__GetGlyfOffset(info,glyph_index);
    *pvertices = (stbtt_vertex *)0x0;
    uVar30 = 0;
    if (-1 < (int)uVar11) {
      uVar13 = (ulong)uVar11;
      uVar9 = *(ushort *)(puVar4 + uVar13) << 8 | *(ushort *)(puVar4 + uVar13) >> 8;
      if ((short)uVar9 < 1) {
        if (uVar9 == 0xffff) {
          uVar20 = 0;
          vertices = (stbtt_vertex *)0x0;
          puVar14 = (ushort *)(puVar4 + uVar13 + 10);
          for (bVar23 = 1; uVar30 = (uint)uVar20, bVar23 != 0; bVar23 = bVar23 & 0x20) {
            count_ctx.bounds = 0;
            count_ctx.started = 0;
            bVar23 = *(byte *)((long)puVar14 + 1);
            puVar15 = puVar14 + 2;
            fVar32 = 0.0;
            fVar35 = 0.0;
            if ((bVar23 & 2) != 0) {
              if ((bVar23 & 1) == 0) {
                fVar32 = (float)(int)(char)*puVar15;
                fVar35 = (float)(int)((long)((ulong)*(byte *)((long)puVar14 + 5) << 0x38) >> 0x38);
                puVar15 = puVar14 + 3;
              }
              else {
                auVar6._9_7_ = 0;
                auVar6._0_9_ = SUB169(ZEXT116(0) << 0x40,7);
                auVar5._10_6_ = 0;
                auVar5._0_10_ = SUB1610(auVar6 << 0x38,6);
                auVar39._11_5_ = 0;
                auVar39._0_11_ = SUB1611(auVar5 << 0x30,5);
                auVar7._1_12_ = SUB1612(auVar39 << 0x28,4);
                auVar7[0] = (char)puVar14[3];
                auVar7._13_3_ = 0;
                auVar34._1_14_ = SUB1614(auVar7 << 0x18,2);
                auVar34[0] = (char)*puVar15;
                auVar34[0xf] = 0;
                auVar34 = ZEXT416((uint)*(byte *)((long)puVar14 + 7) << 0x10 |
                                  (uint)*(byte *)((long)puVar14 + 5)) | auVar34 << 8;
                fVar32 = (float)(int)auVar34._0_2_;
                fVar35 = (float)(int)auVar34._2_2_;
                puVar15 = puVar14 + 4;
              }
            }
            if ((bVar23 & 8) == 0) {
              if ((bVar23 & 0x40) != 0) {
                uVar9 = *puVar15;
                fVar37 = (float)(int)(short)(puVar15[1] << 8 | puVar15[1] >> 8) * 6.1035156e-05;
                puVar15 = puVar15 + 2;
                _local_f8 = ZEXT416((uint)((float)(int)(short)(uVar9 << 8 | uVar9 >> 8) *
                                          6.1035156e-05));
                goto LAB_0016aae3;
              }
              if ((char)bVar23 < '\0') {
                local_f8._0_4_ =
                     (float)(int)CONCAT11((char)*puVar15,*(char *)((long)puVar15 + 1)) *
                     6.1035156e-05;
                local_f8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar15[2],
                                                         *(char *)((long)puVar15 + 5)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                register0x00001288 = 0;
                local_d8._0_4_ =
                     (float)(int)CONCAT11((char)puVar15[1],*(char *)((long)puVar15 + 3)) *
                     6.1035156e-05;
                local_d8._4_4_ =
                     (float)(int)((long)((ulong)CONCAT11((char)puVar15[3],
                                                         *(char *)((long)puVar15 + 7)) << 0x30) >>
                                 0x30) * 6.1035156e-05;
                local_d8._8_8_ = 0;
                puVar15 = puVar15 + 4;
              }
              else {
                _local_f8 = ZEXT812(0x3f800000);
                fStack_ec = 0.0;
                local_d8 = ZEXT816(0x3f80000000000000);
              }
            }
            else {
              fVar37 = (float)(int)(short)(*puVar15 << 8 | *puVar15 >> 8) * 6.1035156e-05;
              puVar15 = puVar15 + 1;
              register0x00001244 = SUB1612((undefined1  [16])0x0,4);
              local_f8._0_4_ = fVar37;
LAB_0016aae3:
              local_d8 = ZEXT416((uint)fVar37) << 0x20;
            }
            uVar11 = stbtt_GetGlyphShape(info,(uint)(ushort)(puVar14[1] << 8 | puVar14[1] >> 8),
                                         (stbtt_vertex **)&count_ctx);
            ptr = count_ctx._0_8_;
            if (0 < (int)uVar11) {
              fVar37 = local_d8._0_4_;
              fVar40 = local_d8._4_4_;
              auVar33._0_4_ = fVar37 * fVar37;
              auVar33._4_4_ = fVar40 * fVar40;
              auVar33._8_4_ = local_d8._8_4_ * local_d8._8_4_;
              auVar33._12_4_ = local_d8._12_4_ * local_d8._12_4_;
              auVar36._0_4_ = (float)local_f8._0_4_ * (float)local_f8._0_4_ + auVar33._0_4_;
              auVar36._4_4_ = (float)local_f8._4_4_ * (float)local_f8._4_4_ + auVar33._4_4_;
              auVar36._8_4_ = fStack_f0 * fStack_f0 + auVar33._8_4_;
              auVar36._12_4_ = fStack_ec * fStack_ec + auVar33._12_4_;
              auVar34 = sqrtps(auVar33,auVar36);
              for (lVar17 = 0; (ulong)uVar11 * 0xe - lVar17 != 0; lVar17 = lVar17 + 0xe) {
                fVar41 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 4 + lVar17) <<
                                            0x30) >> 0x30);
                fVar42 = (float)(int)*(short *)(count_ctx._0_8_ + 2 + lVar17);
                fVar43 = (float)(int)((long)((ulong)*(ushort *)(count_ctx._0_8_ + 6 + lVar17) <<
                                            0x30) >> 0x30);
                auVar38._0_4_ =
                     (int)((fVar42 * (float)local_f8._4_4_ +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar17) * (float)local_f8._0_4_
                           + fVar32) * auVar34._0_4_);
                auVar38._4_4_ =
                     (int)((fVar42 * fVar40 +
                            (float)(int)*(short *)(count_ctx._0_8_ + lVar17) * fVar37 + fVar35) *
                          auVar34._4_4_);
                auVar38._8_4_ =
                     (int)((fVar43 * (float)local_f8._4_4_ + fVar41 * (float)local_f8._0_4_ + fVar32
                           ) * auVar34._0_4_);
                auVar38._12_4_ = (int)((fVar43 * fVar40 + fVar41 * fVar37 + fVar35) * auVar34._4_4_)
                ;
                auVar39 = packssdw(auVar38,auVar38);
                *(long *)(count_ctx._0_8_ + lVar17) = auVar39._0_8_;
              }
              psVar16 = (stbtt_vertex *)ImGui::MemAlloc((ulong)(uVar11 + uVar30) * 0xe);
              if (psVar16 == (stbtt_vertex *)0x0) {
                if (vertices != (stbtt_vertex *)0x0) {
                  ImGui::MemFree(vertices);
                }
                if (ptr != 0) {
                  ImGui::MemFree((void *)ptr);
                }
                goto LAB_0016a593;
              }
              if (0 < (int)uVar30) {
                memcpy(psVar16,vertices,uVar20 * 0xe);
              }
              memcpy(psVar16 + uVar20,(void *)ptr,(ulong)uVar11 * 0xe);
              if (vertices != (stbtt_vertex *)0x0) {
                ImGui::MemFree(vertices);
              }
              ImGui::MemFree((void *)ptr);
              vertices = psVar16;
              uVar30 = uVar11 + uVar30;
            }
            uVar20 = (ulong)uVar30;
            puVar14 = puVar15;
          }
        }
        else {
          uVar30 = 0;
          vertices = (stbtt_vertex *)0x0;
        }
      }
      else {
        uVar20 = (ulong)((uint)uVar9 + (uint)uVar9);
        uVar1 = puVar4[uVar20 + uVar13 + 10];
        uVar2 = puVar4[uVar20 + uVar13 + 0xb];
        bVar23 = puVar4[uVar20 + uVar13 + 8];
        bVar25 = puVar4[uVar20 + uVar13 + 9];
        iVar10 = (uint)bVar23 * 0x100 + (uint)bVar25;
        vertices = (stbtt_vertex *)ImGui::MemAlloc((ulong)((iVar10 + (uint)uVar9 * 2) * 0xe + 0xe));
        if (vertices == (stbtt_vertex *)0x0) {
          return 0;
        }
        puVar14 = (ushort *)(puVar4 + (ulong)CONCAT11(uVar1,uVar2) + uVar20 + uVar13 + 0xc);
        uVar20 = uVar20 & 0xffff;
        lVar17 = (ulong)(CONCAT11(bVar23,bVar25) + 1) * 0xe;
        bVar25 = 0;
        bVar23 = 0;
        for (lVar27 = 0; lVar17 - lVar27 != 0; lVar27 = lVar27 + 0xe) {
          if (bVar25 == 0) {
            bVar23 = (byte)*puVar14;
            if ((bVar23 & 8) == 0) {
              puVar14 = (ushort *)((long)puVar14 + 1);
              bVar25 = 0;
            }
            else {
              bVar25 = *(byte *)((long)puVar14 + 1);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            bVar25 = bVar25 - 1;
          }
          (&vertices[uVar20].type)[lVar27] = bVar23;
        }
        sVar24 = 0;
        for (lVar27 = 0; lVar17 - lVar27 != 0; lVar27 = lVar27 + 0xe) {
          bVar23 = (&vertices[uVar20].type)[lVar27];
          if ((bVar23 & 2) == 0) {
            if ((bVar23 & 0x10) == 0) {
              sVar24 = sVar24 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar26 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar8 = -(ushort)(byte)uVar26;
            if ((bVar23 & 0x10) != 0) {
              uVar8 = (ushort)(byte)uVar26;
            }
            sVar24 = sVar24 + uVar8;
          }
          *(short *)((long)&vertices[uVar20].x + lVar27) = sVar24;
        }
        sVar24 = 0;
        for (lVar27 = 0; lVar17 - lVar27 != 0; lVar27 = lVar27 + 0xe) {
          bVar23 = (&vertices[uVar20].type)[lVar27];
          if ((bVar23 & 4) == 0) {
            if ((bVar23 & 0x20) == 0) {
              sVar24 = sVar24 + (*puVar14 << 8 | *puVar14 >> 8);
              puVar14 = puVar14 + 1;
            }
          }
          else {
            uVar8 = *puVar14;
            puVar14 = (ushort *)((long)puVar14 + 1);
            uVar26 = -(ushort)(byte)uVar8;
            if ((bVar23 & 0x20) != 0) {
              uVar26 = (ushort)(byte)uVar8;
            }
            sVar24 = sVar24 + uVar26;
          }
          *(short *)((long)&vertices[uVar20].y + lVar27) = sVar24;
        }
        was_off = 0;
        uVar30 = 0;
        cx = 0;
        cy = 0;
        sx = 0;
        sy = 0;
        sVar22 = 0;
        sVar29 = 0;
        iVar31 = 0;
        iVar19 = 0;
        num_vertices = 0;
        for (iVar12 = 0; iVar12 <= iVar10; iVar12 = iVar12 + 1) {
          lVar17 = (long)(int)(iVar12 + (uint)uVar9 + (uint)uVar9);
          bVar23 = vertices[lVar17].type;
          sVar24 = vertices[lVar17].x;
          sVar3 = vertices[lVar17].y;
          iVar21 = (int)sVar24;
          iVar28 = (int)sVar3;
          if (iVar31 == iVar12) {
            if (iVar31 != 0) {
              num_vertices = stbtt__close_shape(vertices,num_vertices,was_off,uVar30,sx,sy,sVar22,
                                                sVar29,cx,cy);
            }
            iVar12 = iVar31;
            sx = iVar21;
            sy = iVar28;
            if ((bVar23 & 1) == 0) {
              sVar22 = iVar21;
              sVar29 = iVar28;
              if ((vertices[lVar17 + 1].type & 1) == 0) {
                sx = vertices[lVar17 + 1].x + iVar21 >> 1;
                sy = vertices[lVar17 + 1].y + iVar28 >> 1;
              }
              else {
                iVar12 = iVar31 + 1;
                sx = (int)vertices[lVar17 + 1].x;
                sy = (int)vertices[lVar17 + 1].y;
              }
            }
            uVar30 = bVar23 & 1 ^ 1;
            vertices[num_vertices].type = '\x01';
            vertices[num_vertices].x = (short)sx;
            vertices[num_vertices].y = (short)sy;
            vertices[num_vertices].cx = 0;
            vertices[num_vertices].cy = 0;
            iVar31 = (ushort)(*(ushort *)(puVar4 + (long)iVar19 * 2 + uVar13 + 10) << 8 |
                             *(ushort *)(puVar4 + (long)iVar19 * 2 + uVar13 + 10) >> 8) + 1;
            iVar19 = iVar19 + 1;
            was_off = 0;
            num_vertices = num_vertices + 1;
          }
          else {
            sVar18 = (short)cy;
            if ((bVar23 & 1) == 0) {
              if (was_off == 0) {
                was_off = 1;
                cx = iVar21;
                cy = iVar28;
              }
              else {
                vertices[num_vertices].type = '\x03';
                vertices[num_vertices].x = (short)((uint)(cx + iVar21) >> 1);
                vertices[num_vertices].y = (short)((uint)(iVar28 + cy) >> 1);
                vertices[num_vertices].cx = (short)cx;
                vertices[num_vertices].cy = sVar18;
                was_off = 1;
                num_vertices = num_vertices + 1;
                cx = iVar21;
                cy = iVar28;
              }
            }
            else {
              psVar16 = vertices + num_vertices;
              if (was_off == 0) {
                psVar16->type = '\x02';
                psVar16->x = sVar24;
                psVar16->y = sVar3;
                psVar16->cx = 0;
                sVar18 = 0;
              }
              else {
                psVar16->type = '\x03';
                psVar16->x = sVar24;
                psVar16->y = sVar3;
                psVar16->cx = (short)cx;
              }
              psVar16->cy = sVar18;
              num_vertices = num_vertices + 1;
              was_off = 0;
            }
          }
        }
        uVar30 = stbtt__close_shape(vertices,num_vertices,was_off,uVar30,sx,sy,sVar22,sVar29,cx,cy);
      }
      *pvertices = vertices;
    }
  }
  else {
    count_ctx.first_x = 0.0;
    count_ctx.first_y = 0.0;
    count_ctx.min_y = 0;
    count_ctx.max_y = 0;
    count_ctx.pvertices = (stbtt_vertex *)0x0;
    count_ctx.num_vertices = 0;
    count_ctx._52_4_ = 0;
    count_ctx.x = 0.0;
    count_ctx.y = 0.0;
    count_ctx.min_x = 0;
    count_ctx.max_x = 0;
    count_ctx.bounds = 1;
    count_ctx.started = 0;
    local_a8.min_y = 0;
    local_a8.max_y = 0;
    local_a8.pvertices = (stbtt_vertex *)0x0;
    local_a8.x = 0.0;
    local_a8.y = 0.0;
    local_a8.min_x = 0;
    local_a8.max_x = 0;
    local_a8.bounds = 0;
    local_a8.started = 0;
    local_a8.first_x = 0.0;
    local_a8.first_y = 0.0;
    local_a8.num_vertices = 0;
    local_a8._52_4_ = 0;
    iVar10 = stbtt__run_charstring(info,glyph_index,&count_ctx);
    if (iVar10 != 0) {
      local_a8.pvertices = (stbtt_vertex *)ImGui::MemAlloc((long)count_ctx.num_vertices * 0xe);
      *pvertices = local_a8.pvertices;
      iVar10 = stbtt__run_charstring(info,glyph_index,&local_a8);
      if (iVar10 != 0) {
        return local_a8.num_vertices;
      }
    }
    *pvertices = (stbtt_vertex *)0x0;
LAB_0016a593:
    uVar30 = 0;
  }
  return uVar30;
}

Assistant:

STBTT_DEF int stbtt_GetGlyphShape(const stbtt_fontinfo *info, int glyph_index, stbtt_vertex **pvertices)
{
   if (!info->cff.size)
      return stbtt__GetGlyphShapeTT(info, glyph_index, pvertices);
   else
      return stbtt__GetGlyphShapeT2(info, glyph_index, pvertices);
}